

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O2

bool __thiscall dely_t::before(dely_t *this,coro_http_request *req,coro_http_response *res)

{
  anon_class_8_1_29cdea3e local_48;
  any user_data;
  string local_30;
  
  std::any::any(&user_data,&req->user_data_);
  local_48.user_data = &user_data;
  before::anon_class_8_1_29cdea3e::operator()(&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unauthorized",(allocator<char> *)&local_48);
  cinatra::coro_http_response::set_status_and_content
            (res,unauthorized,&local_30,none,(string_view)(ZEXT816(0x26d00e) << 0x40));
  std::__cxx11::string::~string((string *)&local_30);
  std::any::reset(&user_data);
  return false;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    auto user_data = req.get_user_data();
    CHECK(!user_data.has_value());
    res.set_status_and_content(status_type::unauthorized, "unauthorized");
    return false;
  }